

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O1

vtt_block_t * vtt_block_new(vtt_t *vtt,utf8_char_t *data,size_t size,VTT_BLOCK_TYPE type)

{
  vtt_block_t *pvVar1;
  long lVar2;
  vtt_t *pvVar3;
  
  pvVar1 = (vtt_block_t *)malloc(size + 0x41);
  pvVar1->next = (_vtt_block_t *)0x0;
  pvVar1->type = type;
  pvVar1->timestamp = 0.0;
  pvVar1->duration = 0.0;
  pvVar1->cue_settings = (char *)0x0;
  pvVar1->cue_id = (char *)0x0;
  pvVar1->text_size = size;
  if (type == VTT_CUE) {
    lVar2 = 0x28;
    if (vtt->cue_head == (vtt_block_t *)0x0) {
      pvVar3 = (vtt_t *)&vtt->cue_head;
    }
    else {
LAB_001079b0:
      pvVar3 = *(vtt_t **)((long)&vtt->region_head + lVar2);
    }
  }
  else if (type == VTT_STYLE) {
    lVar2 = 0x18;
    if (vtt->style_head != (vtt_block_t *)0x0) goto LAB_001079b0;
    pvVar3 = (vtt_t *)&vtt->style_head;
  }
  else {
    if (type != VTT_REGION) goto LAB_001079bb;
    lVar2 = 8;
    pvVar3 = vtt;
    if (vtt->region_head != (vtt_block_t *)0x0) goto LAB_001079b0;
  }
  pvVar3->region_head = pvVar1;
  *(vtt_block_t **)((long)&vtt->region_head + lVar2) = pvVar1;
LAB_001079bb:
  if (data == (utf8_char_t *)0x0) {
    memset(pvVar1 + 1,0,size);
  }
  else {
    memcpy(pvVar1 + 1,data,size);
  }
  *(undefined1 *)((long)&pvVar1[1].next + size) = 0;
  return pvVar1;
}

Assistant:

vtt_block_t* vtt_block_new(vtt_t* vtt, const utf8_char_t* data, size_t size, enum VTT_BLOCK_TYPE type)
{
    vtt_block_t* block = malloc(sizeof(vtt_block_t) + size + 1);
    block->next = NULL;
    block->type = type;
    block->timestamp = 0.0;
    block->duration = 0.0;
    block->cue_settings = NULL;
    block->cue_id = NULL;
    block->text_size = size;

    switch (type) {
    case VTT_REGION:
        if (vtt->region_head == NULL) {
            vtt->region_head = block;
        } else {
            vtt->region_tail->next = block;
        }
        vtt->region_tail = block;
        break;
    case VTT_STYLE:
        if (vtt->style_head == NULL) {
            vtt->style_head = block;
        } else {
            vtt->style_tail->next = block;
        }
        vtt->style_tail = block;
        break;
    case VTT_CUE:
        if (vtt->cue_head == NULL) {
            vtt->cue_head = block;
        } else {
            vtt->cue_tail->next = block;
        }
        vtt->cue_tail = block;
        break;
    case VTT_NOTE:
        break;
    }

    utf8_char_t* dest = (utf8_char_t*)vtt_block_data(block);
    if (data) {
        memcpy(dest, data, size);
    } else {
        memset(dest, 0, size);
    }

    dest[size] = '\0';
    return block;
}